

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_column_reader.cpp
# Opt level: O2

void duckdb::StringColumnReader::ReferenceBlock
               (Vector *result,shared_ptr<duckdb::ResizeableBuffer,_true> *block)

{
  shared_ptr<duckdb::ResizeableBuffer,_true> local_38;
  buffer_ptr<VectorBuffer> local_28;
  
  make_shared_ptr<duckdb::ParquetStringVectorBuffer,duckdb::shared_ptr<duckdb::ResizeableBuffer,true>&>
            (&local_38);
  local_28.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_38.internal.super___shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_28.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = local_38.internal.
           super___shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  local_38.internal.super___shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_38.internal.super___shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  StringVector::AddBuffer(result,&local_28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.internal.
              super___shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void StringColumnReader::ReferenceBlock(Vector &result, shared_ptr<ResizeableBuffer> &block) {
	StringVector::AddBuffer(result, make_buffer<ParquetStringVectorBuffer>(block));
}